

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalSB::map_utf8z(CCharmapToLocalSB *this,char *dest,size_t dest_len,utf8_ptr src)

{
  wchar_t wVar1;
  ulong in_RDX;
  undefined1 *in_RSI;
  utf8_ptr *in_RDI;
  size_t map_len;
  uchar *mapping;
  size_t cur_total;
  undefined4 local_38;
  wchar_t in_stack_ffffffffffffffcc;
  CCharmapToLocal *in_stack_ffffffffffffffd0;
  size_t local_28;
  ulong local_20;
  undefined1 *local_18;
  
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x291d85);
    if (wVar1 == L'\0') break;
    utf8_ptr::getch((utf8_ptr *)0x291d98);
    in_stack_ffffffffffffffd0 =
         (CCharmapToLocal *)
         CCharmapToLocal::get_xlation
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(size_t *)in_RDI);
    if (local_20 < CONCAT44(in_stack_ffffffffffffffcc,local_38)) {
      local_20 = 0;
    }
    else {
      memcpy(local_18,in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,local_38));
      local_18 = local_18 + CONCAT44(in_stack_ffffffffffffffcc,local_38);
      local_20 = local_20 - CONCAT44(in_stack_ffffffffffffffcc,local_38);
    }
    local_28 = CONCAT44(in_stack_ffffffffffffffcc,local_38) + local_28;
    utf8_ptr::inc(in_RDI);
  }
  if (local_20 != 0) {
    *local_18 = 0;
  }
  return local_28;
}

Assistant:

size_t CCharmapToLocalSB::map_utf8z(char *dest, size_t dest_len,
                                    utf8_ptr src) const
{
    size_t cur_total;

    /* copy characters until we find the terminating null */
    for (cur_total = 0 ; src.getch() != 0 ; src.inc())
    {
        const unsigned char *mapping;
        size_t map_len;

        /* get the mapping for this character */
        mapping = get_xlation(src.getch(), &map_len);

        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (map_len <= dest_len)
        {
            /* add the sequence */
            memcpy(dest, mapping, map_len);

            /* adjust the output pointer and length remaining */
            dest += map_len;
            dest_len -= map_len;
        }
        else
        {
            /* it doesn't fit - zero the output length remaining */
            dest_len = 0;
        }

        /* count the length in the total */
        cur_total += map_len;
    }

    /* 
     *   add a null terminator, if there's room, but don't count it in the
     *   output length 
     */
    if (dest_len > 0)
        *dest = '\0';
    
    /* return the total length of the result */
    return cur_total;
}